

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::io::(anonymous_namespace)::Fixed16CasesWithSizes_ReadLittleEndian16_Test::
~Fixed16CasesWithSizes_ReadLittleEndian16_Test(Fixed16CasesWithSizes_ReadLittleEndian16_Test *this)

{
  testing::Test::~Test((Test *)(this + -0x10));
  operator_delete((Test *)(this + -0x10),0x18);
  return;
}

Assistant:

TEST_P(Fixed16CasesWithSizes, ReadLittleEndian16) {
  Fixed16Case kFixed16Cases_case = std::get<0>(GetParam());
  int kBlockSizes_case = std::get<1>(GetParam());
  memcpy(buffer_, kFixed16Cases_case.bytes, sizeof(kFixed16Cases_case.bytes));
  ArrayInputStream input(buffer_, sizeof(buffer_), kBlockSizes_case);

  {
    CodedInputStream coded_input(&input);

    uint16_t value;
    EXPECT_TRUE(coded_input.ReadLittleEndian16(&value));
    EXPECT_EQ(kFixed16Cases_case.value, value);
  }

  EXPECT_EQ(sizeof(uint16_t), input.ByteCount());
}